

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_choices_validation_longlong(void)

{
  cargo_t ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *pcVar2;
  cargo_t cargo;
  char *args [3];
  longlong a;
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    iVar1 = cargo_add_option(cargo,0,"--alpha -a",(char *)0x0,"L",&a);
    ctx = cargo;
    if (iVar1 == 0) {
      vd = cargo_validate_choices
                     (CARGO_VALIDATE_CHOICES_NONE,CARGO_LONGLONG,3,0xffffffffffef0bb9,0x1ed36a0,
                      0xf69b5);
      iVar1 = cargo_add_validation(ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (iVar1 == 0) {
        args[2] = "5";
        args[0] = "program";
        args[1] = "--alpha";
        iVar1 = cargo_parse(cargo,0,1,3,args);
        if (iVar1 < 0) {
          args[2] = "-1111111";
          args[0] = "program";
          args[1] = "--alpha";
          iVar1 = cargo_parse(cargo,0,1,3,args);
          pcVar2 = "Failed to parse";
          if (iVar1 == 0) {
            args[2] = "32323232";
            args[0] = "program";
            args[1] = "--alpha";
            iVar1 = cargo_parse(cargo,0,1,3,args);
            if (iVar1 == 0) {
              args[2] = "1010101";
              args[0] = "program";
              args[1] = "--alpha";
              iVar1 = cargo_parse(cargo,0,1,3,args);
              if (iVar1 == 0) {
                args[2] = "4224422";
                args[0] = "program";
                args[1] = "--alpha";
                pcVar2 = (char *)0x0;
                iVar1 = cargo_parse(cargo,0,1,3,args);
                if (-1 < iVar1) {
                  pcVar2 = "Expected parse failure for 4224422";
                }
              }
            }
          }
        }
        else {
          pcVar2 = "Expected parse failure for 5";
        }
      }
      else {
        pcVar2 = "Failed to add validation";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_choices_validation_longlong)
{
    long long int a;

    _CARGO_ADD_TEST_VALIDATE("L", &a,
            cargo_validate_choices, 0, CARGO_LONGLONG,
            3,
            (long long int)-1111111,
            (long long int)32323232,
            (long long int)1010101);
    _CARGO_TEST_VALIDATE_VALUE(5, 1);
    _CARGO_TEST_VALIDATE_VALUE(-1111111, 0);
    _CARGO_TEST_VALIDATE_VALUE(32323232, 0);
    _CARGO_TEST_VALIDATE_VALUE(1010101, 0);
    _CARGO_TEST_VALIDATE_VALUE(4224422, 1);
    _TEST_CLEANUP();
}